

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::snippet_manager::snippet_manager(snippet_manager *this,string *path)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  streamoff sVar4;
  reference pvVar5;
  long *plVar6;
  __mbstate_t extraout_RDX;
  undefined1 auVar7 [16];
  fpos<__mbstate_t> v;
  failure *anon_var_0;
  fpos<__mbstate_t> local_250;
  undefined1 auStack_240 [8];
  pos_type size;
  string local_220 [8];
  ifstream file;
  string *path_local;
  snippet_manager *this_local;
  
  this->loaded_contents = false;
  std::__cxx11::string::string((string *)&this->contents);
  std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::vector
            (&this->line_table);
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,(_Ios_Openmode)path);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    auVar7 = std::istream::tellg();
    size._M_off = auVar7._8_8_;
    auStack_240 = auVar7._0_8_;
    std::fpos<__mbstate_t>::fpos(&local_250,-1);
    bVar3 = std::operator==((fpos<__mbstate_t> *)auStack_240,&local_250);
    bVar1 = true;
    if (!bVar3) {
      sVar4 = std::fpos::operator_cast_to_long((fpos *)auStack_240);
      bVar1 = 0xa00000 < sVar4;
    }
    if (!bVar1) {
      std::istream::seekg((long)local_220,_S_beg);
      v._M_state = extraout_RDX;
      v._M_off = size._M_off;
      to<unsigned_long,std::fpos<__mbstate_t>>((detail *)auStack_240,v);
      std::__cxx11::string::resize((ulong)&this->contents);
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&this->contents,0);
      std::fpos::operator_cast_to_long((fpos *)auStack_240);
      plVar6 = (long *)std::istream::read((char *)local_220,(long)pvVar5);
      std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      build_line_table(this);
      this->loaded_contents = true;
    }
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

snippet_manager(const std::string& path) : loaded_contents(false) {
            std::ifstream file;
            try {
                file.open(path, std::ios::ate);
                if(file.is_open()) {
                    std::ifstream::pos_type size = file.tellg();
                    if(size == std::ifstream::pos_type(-1) || size > max_size) {
                        return;
                    }
                    // else load file
                    file.seekg(0, std::ios::beg);
                    contents.resize(to<std::size_t>(size));
                    if(!file.read(&contents[0], size)) {
                        // error ...
                    }
                    build_line_table();
                    loaded_contents = true;
                }
            } catch(const std::ifstream::failure&) {
                // ...
            }
        }